

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::scaleRow(Highs *this,HighsInt row,double scale_value)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  HighsStatus HVar1;
  string local_a8;
  HighsLogOptions local_88;
  
  clearDerivedModelProperties(this);
  HVar1 = scaleRowInterface(this,row,scale_value);
  local_88.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
  local_88.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
  local_88.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
  local_88.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
  local_88.user_log_callback =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
  local_88.user_log_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
  this_00 = &local_88.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
  local_88.user_callback_active =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_88.user_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"scaleRow","");
  HVar1 = interpretCallStatus(&local_88,HVar1,kOk,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_88.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_88.user_callback.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  if (HVar1 == kError) {
    HVar1 = kError;
  }
  else {
    HVar1 = returnFromHighs(this,HVar1);
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::scaleRow(const HighsInt row, const double scale_value) {
  HighsStatus return_status = HighsStatus::kOk;
  clearDerivedModelProperties();
  HighsStatus call_status = scaleRowInterface(row, scale_value);
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "scaleRow");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}